

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall SymmetricAlgorithm::encryptFinal(SymmetricAlgorithm *this,ByteString *param_1)

{
  bool bVar1;
  ByteString *param_1_local;
  SymmetricAlgorithm *this_local;
  
  bVar1 = this->currentOperation == ENCRYPT;
  if (bVar1) {
    this->currentKey = (SymmetricKey *)0x0;
    this->currentCipherMode = Unknown;
    this->currentPaddingMode = true;
    this->currentCounterBits = 0;
    this->currentTagBytes = 0;
    this->currentOperation = NONE;
    this->currentBufferSize = 0;
  }
  return bVar1;
}

Assistant:

bool SymmetricAlgorithm::encryptFinal(ByteString& /*encryptedData*/)
{
	if (currentOperation != ENCRYPT)
	{
		return false;
	}

	currentKey = NULL;
	currentCipherMode = SymMode::Unknown;
	currentPaddingMode = true;
	currentCounterBits = 0;
	currentTagBytes = 0;
	currentOperation = NONE;
	currentBufferSize = 0;

	return true;
}